

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parseCWL.cpp
# Opt level: O3

CWLDef * parseCWL(CWLDef *__return_storage_ptr__,string *path)

{
  bool includeOptional;
  bool includePlaceholders;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *command;
  pointer line;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  commands;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  lines;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_58;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_40;
  
  *(undefined8 *)&(__return_storage_ptr__->snippets)._M_h._M_rehash_policy = 0;
  (__return_storage_ptr__->snippets)._M_h._M_buckets =
       &(__return_storage_ptr__->snippets)._M_h._M_single_bucket;
  (__return_storage_ptr__->snippets)._M_h._M_bucket_count = 1;
  (__return_storage_ptr__->snippets)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (__return_storage_ptr__->snippets)._M_h._M_element_count = 0;
  (__return_storage_ptr__->snippets)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (__return_storage_ptr__->environments)._M_h._M_buckets = (__buckets_ptr)0x0;
  (__return_storage_ptr__->environments)._M_h._M_bucket_count = 0;
  *(undefined8 *)&(__return_storage_ptr__->environments)._M_h._M_rehash_policy = 0;
  (__return_storage_ptr__->snippets)._M_h._M_rehash_policy._M_next_resize = 0;
  (__return_storage_ptr__->snippets)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (__return_storage_ptr__->environments)._M_h._M_buckets =
       &(__return_storage_ptr__->environments)._M_h._M_single_bucket;
  (__return_storage_ptr__->environments)._M_h._M_bucket_count = 1;
  (__return_storage_ptr__->environments)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (__return_storage_ptr__->environments)._M_h._M_element_count = 0;
  (__return_storage_ptr__->environments)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (__return_storage_ptr__->commands)._M_h._M_buckets = (__buckets_ptr)0x0;
  (__return_storage_ptr__->commands)._M_h._M_bucket_count = 0;
  *(undefined8 *)&(__return_storage_ptr__->commands)._M_h._M_rehash_policy = 0;
  (__return_storage_ptr__->environments)._M_h._M_rehash_policy._M_next_resize = 0;
  (__return_storage_ptr__->environments)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (__return_storage_ptr__->commands)._M_h._M_buckets =
       &(__return_storage_ptr__->commands)._M_h._M_single_bucket;
  (__return_storage_ptr__->commands)._M_h._M_bucket_count = 1;
  (__return_storage_ptr__->commands)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (__return_storage_ptr__->commands)._M_h._M_element_count = 0;
  (__return_storage_ptr__->commands)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (__return_storage_ptr__->commands)._M_h._M_rehash_policy._M_next_resize = 0;
  (__return_storage_ptr__->commands)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  getFileContents(&local_40,path);
  extractCommands(&local_58,&local_40);
  if (local_58.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_58.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    includeOptional = (g_config->latex).cwl.includeOptional;
    includePlaceholders = (g_config->latex).cwl.includePlaceholders;
    line = local_58.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
    do {
      processCommand(line,__return_storage_ptr__,includeOptional,includePlaceholders);
      line = line + 1;
    } while (line != local_58.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_58);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_40);
  return __return_storage_ptr__;
}

Assistant:

CWLDef parseCWL (const string &path) {
    CWLDef data {};
    auto lines = getFileContents(path);
    auto commands = extractCommands(lines);
    processCommands(data, commands);
    return data;
}